

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Teleport.cpp
# Opt level: O0

int Teleport::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  ulong uVar1;
  UnityAudioParameterDefinition *pUVar2;
  int numparams;
  UnityAudioEffectDefinition *definition_local;
  
  uVar1 = SUB168(ZEXT816(8) * ZEXT816(0x40),0);
  if (SUB168(ZEXT816(8) * ZEXT816(0x40),8) != 0) {
    uVar1 = 0xffffffffffffffff;
  }
  pUVar2 = (UnityAudioParameterDefinition *)operator_new__(uVar1);
  definition->paramdefs = pUVar2;
  RegisterParameter(definition,"Stream","",0.0,7.0,0.0,1.0,1.0,0,
                    "External audio stream to read from or write to.");
  RegisterParameter(definition,"Send","",0.0,1.0,0.0,1.0,1.0,1,
                    "Gain of signal sent to the external audio stream.");
  RegisterParameter(definition,"Input Gain","",0.0,1.0,1.0,1.0,1.0,2,
                    "Gain of signal passing through effect.");
  RegisterParameter(definition,"Teleport Gain","",0.0,1.0,1.0,1.0,1.0,3,
                    "Gain of the received external audio stream.");
  RegisterParameter(definition,"Param1","",0.0,1.0,0.0,1.0,1.0,4,
                    "User-defined parameter 1 (read/write)");
  RegisterParameter(definition,"Param2","",0.0,1.0,0.0,1.0,1.0,5,
                    "User-defined parameter 2 (read/write)");
  RegisterParameter(definition,"Param3","",0.0,1.0,0.0,1.0,1.0,6,
                    "User-defined parameter 3 (read/write)");
  RegisterParameter(definition,"Param4","",0.0,1.0,0.0,1.0,1.0,7,
                    "User-defined parameter 4 (read/write)");
  return 8;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Stream", "", 0.0f, 7.0f, 0.0f, 1.0f, 1.0f, P_STREAM, "External audio stream to read from or write to.");
        RegisterParameter(definition, "Send", "", 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, P_SEND, "Gain of signal sent to the external audio stream.");
        RegisterParameter(definition, "Input Gain", "", 0.0f, 1.0f, 1.0f, 1.0f, 1.0f, P_INPUTGAIN, "Gain of signal passing through effect.");
        RegisterParameter(definition, "Teleport Gain", "", 0.0f, 1.0f, 1.0f, 1.0f, 1.0f, P_TELEPORTGAIN, "Gain of the received external audio stream.");
        RegisterParameter(definition, "Param1", "", 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, P_PARAM1, "User-defined parameter 1 (read/write)");
        RegisterParameter(definition, "Param2", "", 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, P_PARAM2, "User-defined parameter 2 (read/write)");
        RegisterParameter(definition, "Param3", "", 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, P_PARAM3, "User-defined parameter 3 (read/write)");
        RegisterParameter(definition, "Param4", "", 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, P_PARAM4, "User-defined parameter 4 (read/write)");
        return numparams;
    }